

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Reader * __thiscall
capnp::ParsedSchema::getSourceInfo(Reader *__return_storage_ptr__,ParsedSchema *this)

{
  Fault local_c0;
  NullableValue<capnp::schema::Node::SourceInfo::Reader> local_b8 [3];
  
  SchemaParser::getSourceInfo
            ((Maybe<capnp::schema::Node::SourceInfo::Reader> *)local_b8,this->parser,
             (this->super_Schema).raw);
  if (local_b8[0].isSet == true) {
    (__return_storage_ptr__->_reader).dataSize = local_b8[0].field_1._32_4_;
    (__return_storage_ptr__->_reader).pointerCount = local_b8[0].field_1._36_2_;
    *(undefined2 *)&(__return_storage_ptr__->_reader).field_0x26 = local_b8[0].field_1._38_2_;
    *(undefined8 *)&(__return_storage_ptr__->_reader).nestingLimit = local_b8[0].field_1._40_8_;
    (__return_storage_ptr__->_reader).data = (void *)local_b8[0].field_1._16_8_;
    (__return_storage_ptr__->_reader).pointers = (WirePointer *)local_b8[0].field_1._24_8_;
    (__return_storage_ptr__->_reader).segment = (SegmentReader *)local_b8[0].field_1._0_8_;
    (__return_storage_ptr__->_reader).capTable = (CapTableReader *)local_b8[0].field_1._8_8_;
    return __return_storage_ptr__;
  }
  local_c0.exception = (Exception *)0x0;
  local_b8[0].isSet = false;
  local_b8[0]._1_7_ = 0;
  local_b8[0].field_1.value._reader.segment = (SegmentReader *)0x0;
  kj::_::Debug::Fault::init
            (&local_c0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
            );
  kj::_::Debug::Fault::fatal(&local_c0);
}

Assistant:

schema::Node::SourceInfo::Reader ParsedSchema::getSourceInfo() const {
  return KJ_ASSERT_NONNULL(parser->getSourceInfo(*this));
}